

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_list(t_sigmund *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_symbol *s_00;
  t_float *arraypoints;
  _garray *x_00;
  ulong uVar2;
  uint uVar3;
  char *fmt;
  uint n;
  t_float tVar4;
  t_float tVar5;
  t_float srate;
  int arraysize;
  t_word *wordarray;
  int local_3c;
  t_word *local_38;
  
  s_00 = atom_getsymbolarg(0,argc,argv);
  tVar4 = atom_getfloatarg(1,argc,argv);
  tVar5 = atom_getfloatarg(2,argc,argv);
  srate = atom_getfloatarg(3,argc,argv);
  atom_getfloatarg(4,argc,argv);
  local_38 = (t_word *)0x0;
  if (argc < 5) {
    post("sigmund: array-name, npts, array-onset, samplerate, loud");
    return;
  }
  n = (uint)tVar4;
  if (0x3f < (int)n) {
    iVar1 = ilog2(n);
    if (1 << ((byte)iVar1 & 0x1f) == n) {
      uVar3 = (uint)tVar5;
      if (-1 < (int)uVar3) {
        if (srate <= 0.0) {
          fmt = "sigmund: bad samplerate";
          goto LAB_001abd62;
        }
        arraypoints = (t_float *)getbytes((long)(int)(n * 4));
        x_00 = (_garray *)pd_findbyclass(s_00,garray_class);
        if (x_00 != (_garray *)0x0) {
          iVar1 = garray_getfloatwords(x_00,&local_3c,&local_38);
          if (iVar1 != 0) {
            if ((int)(n + uVar3) <= local_3c) {
              if (local_3c < (int)n) {
                pd_error((void *)0x0,"sigmund~: too few points in array");
              }
              else {
                uVar2 = 0;
                do {
                  arraypoints[uVar2] = local_38[uVar3 + uVar2].w_float;
                  uVar2 = uVar2 + 1;
                } while (n != uVar2);
                sigmund_doit(x,n,arraypoints,n,srate);
              }
              goto LAB_001abd41;
            }
          }
        }
        pd_error((void *)0x0,"%s: array missing or too small",s_00->s_name);
LAB_001abd41:
        freebytes(arraypoints,(long)(int)(n * 4));
        return;
      }
      fmt = "sigmund: negative onset";
      goto LAB_001abd62;
    }
  }
  fmt = "sigmund: bad npoints";
LAB_001abd62:
  pd_error((void *)0x0,fmt);
  return;
}

Assistant:

static void sigmund_list(t_sigmund *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *syminput = atom_getsymbolarg(0, argc, argv);
    int npts = atom_getfloatarg(1, argc, argv);
    int onset = atom_getfloatarg(2, argc, argv);
    t_float srate = atom_getfloatarg(3, argc, argv);
    int loud = atom_getfloatarg(4, argc, argv);
    int arraysize, totstorage, nfound, i, bufsize;
    t_garray *a;
    t_float *arraypoints, pit;
    t_word *wordarray = 0;
    if (argc < 5)
    {
        post(
         "sigmund: array-name, npts, array-onset, samplerate, loud");
        return;
    }
    if (npts < 64 || npts != (1 << ilog2(npts))) 
    {
        pd_error(0, "sigmund: bad npoints");
        return;
    }
    if (onset < 0)
    {
        pd_error(0, "sigmund: negative onset");
        return;
    }
    if (srate <= 0)
    {
        pd_error(0, "sigmund: bad samplerate");
        return;
    }
    bufsize = sizeof(t_float)*npts;
    arraypoints = (t_float *)getbytes(bufsize);
    if (!(a = (t_garray *)pd_findbyclass(syminput, garray_class)) ||
        !garray_getfloatwords(a, &arraysize, &wordarray) ||
            arraysize < onset + npts)
    {
        pd_error(0, "%s: array missing or too small", syminput->s_name);
        goto cleanup;
    }
    if (arraysize < npts)
    {
        pd_error(0, "sigmund~: too few points in array");
        goto cleanup;
    }
    for (i = 0; i < npts; i++)
        arraypoints[i] = wordarray[i+onset].w_float;
    sigmund_doit(x, npts, arraypoints, loud, srate);
cleanup:
    freebytes(arraypoints, bufsize);
}